

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_posix_file_storage.cpp
# Opt level: O0

void __thiscall
cppcms::sessions::session_file_storage_factory::session_file_storage_factory
          (session_file_storage_factory *this,string *path,int conc,int proc_no,bool force_lock)

{
  session_file_storage *in_RSI;
  shared_ptr<cppcms::sessions::session_file_storage> *in_RDI;
  byte in_R8B;
  bool in_stack_000000ff;
  int in_stack_00000100;
  int in_stack_00000104;
  string *in_stack_00000108;
  session_file_storage *in_stack_00000110;
  string local_50 [55];
  byte local_19;
  
  local_19 = in_R8B & 1;
  session_storage_factory::session_storage_factory((session_storage_factory *)in_RDI);
  (in_RDI->super___shared_ptr<cppcms::sessions::session_file_storage,_(__gnu_cxx::_Lock_policy)2>).
  _M_ptr = (element_type *)&PTR_get_00531070;
  operator_new(0x60);
  std::__cxx11::string::string(local_50,(string *)in_RSI);
  session_file_storage::session_file_storage
            (in_stack_00000110,in_stack_00000108,in_stack_00000104,in_stack_00000100,
             in_stack_000000ff);
  std::shared_ptr<cppcms::sessions::session_file_storage>::
  shared_ptr<cppcms::sessions::session_file_storage,void>(in_RDI,in_RSI);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

session_file_storage_factory::session_file_storage_factory(std::string path,int conc,int proc_no,bool force_lock) :
	storage_(new session_file_storage(path,conc,proc_no,force_lock))
{
}